

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O1

void vkt::tessellation::anon_unknown_2::initCommonPrograms
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TessPrimitiveType TVar2;
  char *pcVar3;
  size_t sVar4;
  ProgramSources *pPVar5;
  ostream *poVar6;
  ostringstream src;
  undefined1 auStack_218 [8];
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  uint local_1d0;
  value_type local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  highp vec2 in_v_position;\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec2 in_tc_position;\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    in_tc_position = in_v_position;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vert","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar1 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  TVar2 = caseDef->primitiveType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(vertices = ",0x12)
  ;
  poVar6 = (ostream *)
           std::ostream::operator<<(local_1a8,4 - (uint)(TVar2 == TESSPRIMITIVETYPE_TRIANGLES));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n    float inner0;\n    float inner1;\n    float outer0;\n    float outer1;\n    float outer2;\n    float outer3;\n} sb_levels;\n"
             ,0xc4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"layout(location = 0) in  highp vec2 in_tc_position[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"layout(location = 0) out highp vec2 in_te_position[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n",0x47)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelInner[0] = sb_levels.inner0;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelInner[1] = sb_levels.inner1;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelOuter[0] = sb_levels.outer0;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelOuter[1] = sb_levels.outer1;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelOuter[2] = sb_levels.outer2;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    gl_TessLevelOuter[3] = sb_levels.outer3;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"tesc","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 3;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  highp   vec4 in_f_color;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    o_color = in_f_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"frag","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void initCommonPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(!programCollection.glslSources.contains("vert"));
	DE_ASSERT(!programCollection.glslSources.contains("tesc"));
	DE_ASSERT(!programCollection.glslSources.contains("frag"));

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_v_position;\n"
			<< "layout(location = 0) out highp vec2 in_tc_position;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_position = in_v_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		const int numVertices = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 4);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = " << numVertices << ") out;\n"
			<< "\n"
			<< getTessLevelsSSBODeclaration()
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_tc_position[];\n"
			<< "layout(location = 0) out highp vec2 in_te_position[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = sb_levels.inner0;\n"
			<< "    gl_TessLevelInner[1] = sb_levels.inner1;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = sb_levels.outer0;\n"
			<< "    gl_TessLevelOuter[1] = sb_levels.outer1;\n"
			<< "    gl_TessLevelOuter[2] = sb_levels.outer2;\n"
			<< "    gl_TessLevelOuter[3] = sb_levels.outer3;\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp   vec4 in_f_color;\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = in_f_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}